

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O0

void __thiscall
gimage::PNMImageIO::loadHeader(PNMImageIO *this,char *name,long *width,long *height,int *depth)

{
  ulong uVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  float scale;
  long maxval;
  long *in_stack_00000500;
  long *in_stack_00000508;
  float *in_stack_00000510;
  long *in_stack_00000518;
  int *in_stack_00000520;
  char *in_stack_00000528;
  allocator *__lhs;
  allocator local_99;
  string *in_stack_ffffffffffffff68;
  IOException *in_stack_ffffffffffffff70;
  
  uVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI,1);
  if ((uVar1 & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    __lhs = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff68,(char *)in_RSI,__lhs);
    std::operator+((char *)__lhs,in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)in_RSI);
    gutil::IOException::IOException(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __cxa_throw(uVar2,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  anon_unknown_11::readPNMHeader
            (in_stack_00000528,in_stack_00000520,in_stack_00000518,in_stack_00000510,
             in_stack_00000508,in_stack_00000500);
  return;
}

Assistant:

void PNMImageIO::loadHeader(const char *name, long &width, long &height,
                            int &depth) const
{
  long  maxval;
  float scale;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  readPNMHeader(name, depth, maxval, scale, width, height);
}